

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int **ppiVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 in_stack_fffffffffffff828;
  undefined4 uVar11;
  SharedMatting *pSVar10;
  allocator<char> local_7c9;
  undefined4 local_7c8 [2];
  Mat *local_7c0;
  undefined8 local_7b8;
  Mat alp;
  undefined4 uStack_7a4;
  long *local_760;
  Mat b_k;
  long *local_700;
  _Vector_base<int,_std::allocator<int>_> local_6e8;
  _InputArray local_6d0;
  undefined8 local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  Mat src;
  uint local_608;
  uint local_604;
  long local_600;
  undefined8 *local_5d0;
  long *local_5c8;
  SharedMatting sm;
  Mat element;
  Rect ccomp;
  Mat element_e;
  Mat trimap;
  Mat dil;
  Mat ero;
  Mat can;
  Mat can2;
  Mat can1;
  Mat out;
  Matx<double,_4,_1> local_98;
  Matx<double,_4,_1> local_78;
  Matx<double,_4,_1> local_58;
  
  uVar11 = (undefined4)((ulong)in_stack_fffffffffffff828 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sm,"input/lady1.jpg",(allocator<char> *)&out);
  cv::imread((string *)&src,(int)&sm);
  std::__cxx11::string::~string((string *)&sm);
  cv::Mat::Mat(&out);
  cv::Mat::Mat(&can1);
  cv::Mat::Mat(&can2);
  cv::Mat::Mat(&can);
  cv::Mat::Mat(&ero);
  cv::Mat::Mat(&dil);
  cv::Mat::Mat(&trimap);
  sm._16_8_ = 0;
  sm.pImg = (Mat)0x0;
  sm._1_3_ = 0x10100;
  _element = 0x2010000;
  local_618 = 0xa0000000a;
  local_620 = 0xffffffffffffffff;
  sm._8_8_ = (string *)&src;
  cv::boxFilter(&sm,&element,0xffffffffffffffff,&local_618,&local_620,1,CONCAT44(uVar11,4));
  sm._16_8_ = 0;
  sm.pImg = (Mat)0x0;
  sm._1_3_ = 0x10100;
  _element = 0x2010000;
  sm._8_8_ = &out;
  cv::Canny((_InputArray *)&sm,(_OutputArray *)&element,36.0,36.0,3,false);
  ccomp.x = 0;
  ccomp.y = 0;
  ccomp.width = 0;
  ccomp.height = 0;
  sm._16_8_ = 0;
  sm.pImg = (Mat)0x0;
  sm._1_3_ = 0x30100;
  local_628 = 0xa0000000a;
  sm._8_8_ = &out;
  cv::Matx<double,_4,_1>::Matx(&local_58);
  local_58.val[2] = 0.0;
  local_58.val[3] = 0.0;
  local_58.val[0] = 0.0;
  local_58.val[1] = 0.0;
  cv::Matx<double,_4,_1>::Matx(&local_78);
  local_78.val[0] = 3.0;
  local_78.val[1] = 3.0;
  local_78.val[2] = 3.0;
  local_78.val[3] = 0.0;
  cv::Matx<double,_4,_1>::Matx(&local_98);
  local_98.val[0] = 3.0;
  local_98.val[1] = 3.0;
  local_98.val[2] = 3.0;
  local_98.val[3] = 0.0;
  cv::floodFill(&sm,&local_628,&local_58,&ccomp,&local_78,&local_98,4);
  sm._16_8_ = 0;
  sm.pImg = (Mat)0x0;
  sm._1_3_ = 0x10100;
  sm._8_8_ = &out;
  _element = 0x2010000;
  cv::Canny((_InputArray *)&sm,(_OutputArray *)&element,15.0,15.0,3,false);
  sm._8_8_ = &can1;
  sm._16_8_ = 0;
  sm.pImg = (Mat)0x0;
  sm._1_3_ = 0x10100;
  _element = 0x1010000;
  _element_e = 0x2010000;
  cv::addWeighted((_InputArray *)&sm,1.0,(_InputArray *)&element,1.0,0.0,(_OutputArray *)&element_e,
                  -1);
  local_630 = 0x2300000023;
  local_638 = 0xffffffffffffffff;
  cv::getStructuringElement(&element,2);
  local_640 = 0x3200000032;
  local_648 = 0xffffffffffffffff;
  cv::getStructuringElement(&element_e,2);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_670 = 0xffffffffffffffff;
  local_7c0 = &element_e;
  cv::morphologyDefaultBorderValue();
  cv::dilate(&b_k,&alp,local_7c8,&local_670,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_678 = 0xffffffffffffffff;
  local_7c0 = &element_e;
  cv::morphologyDefaultBorderValue();
  cv::dilate(&b_k,&alp,local_7c8,&local_678,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_680 = 0xffffffffffffffff;
  local_7c0 = &element;
  cv::morphologyDefaultBorderValue();
  cv::dilate(&b_k,&alp,local_7c8,&local_680,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_688 = 0xffffffffffffffff;
  local_7c0 = &element;
  cv::morphologyDefaultBorderValue();
  cv::dilate(&b_k,&alp,local_7c8,&local_688,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_690 = 0xffffffffffffffff;
  local_7c0 = &element_e;
  cv::morphologyDefaultBorderValue();
  cv::erode(&b_k,&alp,local_7c8,&local_690,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_698 = 0xffffffffffffffff;
  local_7c0 = &element_e;
  cv::morphologyDefaultBorderValue();
  cv::erode(&b_k,&alp,local_7c8,&local_698,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_6a0 = 0xffffffffffffffff;
  local_7c0 = &element_e;
  cv::morphologyDefaultBorderValue();
  cv::erode(&b_k,&alp,local_7c8,&local_6a0,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_6a8 = 0xffffffffffffffff;
  local_7c0 = &element_e;
  cv::morphologyDefaultBorderValue();
  cv::erode(&b_k,&alp,local_7c8,&local_6a8,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_6b0 = 0xffffffffffffffff;
  local_7c0 = &element;
  cv::morphologyDefaultBorderValue();
  cv::erode(&b_k,&alp,local_7c8,&local_6b0,1,0,&sm);
  _b_k = 0x1010000;
  _alp = 0x2010000;
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_6b8 = 0xffffffffffffffff;
  pSVar10 = &sm;
  local_7c0 = &element;
  cv::morphologyDefaultBorderValue();
  cv::erode(&b_k,&alp,local_7c8,&local_6b8,1,0,pSVar10);
  uVar11 = (undefined4)((ulong)pSVar10 >> 0x20);
  sm._16_8_ = 0;
  sm.pImg = (Mat)0x0;
  sm._1_3_ = 0x10100;
  _b_k = 0x1010000;
  _alp = CONCAT44(uStack_7a4,0x2010000);
  sm._8_8_ = &dil;
  cv::addWeighted((_InputArray *)&sm,0.5,(_InputArray *)&b_k,0.5,0.0,(_OutputArray *)&alp,-1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sm,"result/lady_trimap1.jpg",(allocator<char> *)local_7c8);
  _b_k = 0x1010000;
  _alp = 0;
  cv::imwrite((string *)&sm,(_InputArray *)&b_k,(vector *)&alp);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&alp);
  std::__cxx11::string::~string((string *)&sm);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok");
  std::endl<char,std::char_traits<char>>(poVar1);
  SharedMatting::SharedMatting(&sm);
  SharedMatting::loadImage(&sm,"input/lady1.jpg");
  SharedMatting::loadTrimap(&sm,"result/lady_trimap1.jpg");
  SharedMatting::solveAlpha(&sm);
  SharedMatting::save(&sm,"result/lady_alpha1.jpg");
  ppiVar2 = SharedMatting::alpha_return(&sm);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&alp,"background/background.jpg",(allocator<char> *)local_7c8);
  cv::imread((string *)&b_k,(int)&alp);
  std::__cxx11::string::~string((string *)&alp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_7c8,"result/lady_alpha1.jpg",(allocator<char> *)&local_6d0);
  cv::imread((string *)&alp,(int)local_7c8);
  std::__cxx11::string::~string((string *)local_7c8);
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_6d0.sz.width = 0;
  local_6d0.sz.height = 0;
  local_6d0.flags = 0x2010000;
  local_650 = 0xa0000000a;
  local_658 = 0xffffffffffffffff;
  local_7c0 = &alp;
  local_6d0.obj = (string *)&alp;
  cv::boxFilter(local_7c8,&local_6d0,0xffffffffffffffff,&local_650,&local_658,1,CONCAT44(uVar11,4));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_7c8,"result/lady_alpha1.jpg",&local_7c9);
  local_6d0.sz.width = 0;
  local_6d0.sz.height = 0;
  local_6d0.flags = 0x1010000;
  local_6e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d0.obj = (string *)&alp;
  cv::imwrite((string *)local_7c8,&local_6d0,(vector *)&local_6e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_6e8);
  std::__cxx11::string::~string((string *)local_7c8);
  uVar3 = 0;
  uVar9 = (ulong)local_604;
  if ((int)local_604 < 1) {
    uVar9 = uVar3;
  }
  uVar8 = (ulong)local_608;
  if ((int)local_608 < 1) {
    uVar8 = uVar3;
  }
  for (; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    lVar4 = 0;
    for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      ppiVar2[uVar3][uVar6] = (uint)*(byte *)(lVar4 + *local_760 * uVar3);
      lVar4 = lVar4 + 3;
    }
  }
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_6d0.sz.width = 0;
  local_6d0.sz.height = 0;
  local_6d0.flags = 0x2010000;
  local_660 = CONCAT44((int)*local_5d0,(int)((ulong)*local_5d0 >> 0x20));
  local_7c0 = &b_k;
  local_6d0.obj = (string *)&b_k;
  cv::resize(0,0);
  for (uVar3 = 0; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    lVar5 = *local_700 * uVar3;
    lVar7 = *local_5c8 * uVar3 + local_600;
    lVar4 = 2;
    for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      *(char *)(lVar7 + -2 + lVar4) =
           (char)(int)((1.0 - (double)ppiVar2[uVar3][uVar6] / 255.0) *
                       (double)*(byte *)(lVar5 + -2 + lVar4) +
                      ((double)*(byte *)(lVar7 + -2 + lVar4) * (double)ppiVar2[uVar3][uVar6]) /
                      255.0);
      *(char *)(lVar7 + -1 + lVar4) =
           (char)(int)((1.0 - (double)ppiVar2[uVar3][uVar6] / 255.0) *
                       (double)*(byte *)(lVar5 + -1 + lVar4) +
                      ((double)*(byte *)(lVar7 + -1 + lVar4) * (double)ppiVar2[uVar3][uVar6]) /
                      255.0);
      *(char *)(lVar7 + lVar4) =
           (char)(int)((1.0 - (double)ppiVar2[uVar3][uVar6] / 255.0) *
                       (double)*(byte *)(lVar5 + lVar4) +
                      ((double)*(byte *)(lVar7 + lVar4) * (double)ppiVar2[uVar3][uVar6]) / 255.0);
      lVar4 = lVar4 + 3;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_7c8,"result/lady_result1.jpg",&local_7c9);
  local_6d0.sz.width = 0;
  local_6d0.sz.height = 0;
  local_6d0.flags = 0x1010000;
  local_6e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d0.obj = &src;
  cv::imwrite((string *)local_7c8,&local_6d0,(vector *)&local_6e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_6e8);
  std::__cxx11::string::~string((string *)local_7c8);
  local_7b8 = 0;
  local_7c8[0] = 0x1010000;
  local_6d0.sz.width = 0;
  local_6d0.sz.height = 0;
  local_6d0.flags = 0x2010000;
  local_668 = CONCAT44((int)*local_5d0,(int)((ulong)*local_5d0 >> 0x20));
  local_7c0 = &src;
  local_6d0.obj = &src;
  cv::resize(0,0,local_7c8,&local_6d0,&local_668,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_7c8,"result",(allocator<char> *)&local_6e8);
  local_6d0.sz.width = 0;
  local_6d0.sz.height = 0;
  local_6d0.flags = 0x1010000;
  local_6d0.obj = &src;
  cv::imshow((string *)local_7c8,&local_6d0);
  std::__cxx11::string::~string((string *)local_7c8);
  cv::waitKey(0);
  cv::Mat::~Mat(&alp);
  cv::Mat::~Mat(&b_k);
  SharedMatting::~SharedMatting(&sm);
  cv::Mat::~Mat(&element_e);
  cv::Mat::~Mat(&element);
  cv::Mat::~Mat(&trimap);
  cv::Mat::~Mat(&dil);
  cv::Mat::~Mat(&ero);
  cv::Mat::~Mat(&can);
  cv::Mat::~Mat(&can2);
  cv::Mat::~Mat(&can1);
  cv::Mat::~Mat(&out);
  cv::Mat::~Mat(&src);
  return 0;
}

Assistant:

int main()
{
	Mat src = imread("input/lady1.jpg");
	Mat out, can1,can2, can, ero, dil,trimap;
	boxFilter(src, out, -1, Size(10, 10));
	Canny(out, can1, 36, 36, 3);
       
	Rect ccomp;
	floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	Canny(out, can2, 15, 15, 3);
	addWeighted(can1, 1.0, can2, 1.0, 0.0, can);

	/*floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	floodFill(out, Point(1963, 2400), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));*/
    Mat element = getStructuringElement(MORPH_ELLIPSE, Size(35, 35));
	Mat element_e = getStructuringElement(MORPH_ELLIPSE, Size(50, 50));
	dilate(can, dil, element_e);
	dilate(dil, dil, element_e);
	dilate(dil, dil, element);
	dilate(dil, dil, element);
	erode(dil, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element);
    erode(ero, ero, element);
	//cvtColor(out, g_grayImage, CV_RGB2GRAY);
	//threshold(g_grayImage, g_dstImage, g_nThresholdValue, 255, g_nThresholdType);
	addWeighted(dil,0.5,ero,0.5,0.0,trimap);
	//imwrite("dil.jpg", dil);
	//imwrite("ero.jpg", ero);
	imwrite("result/lady_trimap1.jpg", trimap);
	cout << "ok" << endl; 

        SharedMatting sm;
        sm.loadImage("input/lady1.jpg");
        sm.loadTrimap("result/lady_trimap1.jpg");
        sm.solveAlpha();
        sm.save("result/lady_alpha1.jpg");
        int ** alpha = sm.alpha_return();
        Mat b_k = imread("background/background.jpg");
        Mat alp = imread("result/lady_alpha1.jpg");
        boxFilter(alp, alp, -1, Size(10, 10));
        imwrite("result/lady_alpha1.jpg", alp);
        int src_row = src.rows;
        int src_col = src.cols;
        int i,j;
       for (i=0; i<src_row ;i++) 
        {
          
           for (j=0; j<src_col; j++)
           {
              alpha[i][j] = double (alp.at<Vec3b>(i,j)[0]); 
           }
        }
    
        resize(b_k, b_k, src.size());

        for (i=0; i<src_row ;i++) 
        {
           uchar* data_s = src.ptr<uchar>(i);
           uchar* data_b = b_k.ptr<uchar>(i);
           uchar* data_a = alp.ptr<uchar>(i);
           for (j=0; j<src_col; j++)
           {
              data_s[3*j] = uchar(double(data_s[3*j]) * double(alpha[i][j])/255.0 + double(data_b[3*j]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+1] = uchar(double(data_s[3*j+1]) * double(alpha[i][j])/255.0 + double(data_b[3*j+1]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+2] = uchar(double(data_s[3*j+2]) * double(alpha[i][j])/255.0 + double(data_b[3*j+2]) * (1.0 - double(alpha[i][j])/255.0)); 
           }
        }
        imwrite("result/lady_result1.jpg", src);
        resize(src, src, src.size());
        imshow("result",src);
        waitKey(0);
    return 0;
}